

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QPdfEnginePrivate::AttachmentInfo>::moveAppend
          (QGenericArrayOps<QPdfEnginePrivate::AttachmentInfo> *this,AttachmentInfo *b,
          AttachmentInfo *e)

{
  qsizetype *pqVar1;
  AttachmentInfo *pAVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char *pcVar8;
  
  if ((b != e) && (b < e)) {
    pAVar2 = (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size;
      pDVar4 = (b->fileName).d.d;
      (b->fileName).d.d = (Data *)0x0;
      pAVar2[lVar3].fileName.d.d = pDVar4;
      pcVar5 = (b->fileName).d.ptr;
      (b->fileName).d.ptr = (char16_t *)0x0;
      pAVar2[lVar3].fileName.d.ptr = pcVar5;
      qVar6 = (b->fileName).d.size;
      (b->fileName).d.size = 0;
      pAVar2[lVar3].fileName.d.size = qVar6;
      pDVar7 = (b->data).d.d;
      (b->data).d.d = (Data *)0x0;
      pAVar2[lVar3].data.d.d = pDVar7;
      pcVar8 = (b->data).d.ptr;
      (b->data).d.ptr = (char *)0x0;
      pAVar2[lVar3].data.d.ptr = pcVar8;
      qVar6 = (b->data).d.size;
      (b->data).d.size = 0;
      pAVar2[lVar3].data.d.size = qVar6;
      pDVar4 = (b->mimeType).d.d;
      (b->mimeType).d.d = (Data *)0x0;
      pAVar2[lVar3].mimeType.d.d = pDVar4;
      pcVar5 = (b->mimeType).d.ptr;
      (b->mimeType).d.ptr = (char16_t *)0x0;
      pAVar2[lVar3].mimeType.d.ptr = pcVar5;
      qVar6 = (b->mimeType).d.size;
      (b->mimeType).d.size = 0;
      pAVar2[lVar3].mimeType.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }